

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void Fixpp::
     visitMessage<should_visit_message_with_multiple_chars_message_type::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>,Fixpp::TypedParsingContext<void>>
               (ParsingContext *context,Context *visitor,StreamCursor *param_3)

{
  impl *this;
  bool bVar1;
  char cVar2;
  pair<bool,_int> pVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  StreamCursor *cursor;
  char *pcVar7;
  long *plVar8;
  MessageVisitor<should_visit_message_with_multiple_chars_message_type::Visitor,_DefaultTestRules<Fixpp::v44::Spec::Dictionary>_>
  messageVisitor;
  pair<bool,_std::pair<const_char_*,_unsigned_long>_> beginString;
  pair<bool,_std::pair<const_char_*,_unsigned_long>_> msgType;
  
  this = (impl *)context->cursor;
  impl::matchTag<Fixpp::TagT<8u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
            ((pair<bool,_std::pair<const_char_*,_unsigned_long>_> *)&messageVisitor.visitor,this,
             param_3);
  bVar1 = StreamCursor::advance((StreamCursor *)this,1);
  if (!bVar1) {
    pcVar7 = "Expected BodyLength after BeginString, got EOFs";
LAB_00a2bdbf:
    ParsingContext::setError(context,Incomplete,pcVar7);
    return;
  }
  pVar3 = impl::matchTag<Fixpp::TagT<9u,Fixpp::Type::Int>,int>((StreamCursor *)this);
  if (((ulong)pVar3 & 1) != 0) {
    bVar1 = StreamCursor::advance((StreamCursor *)this,1);
    if (bVar1) {
      impl::matchTag<Fixpp::TagT<35u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
                ((pair<bool,_std::pair<const_char_*,_unsigned_long>_> *)&beginString.second.second,
                 this,cursor);
      bVar1 = StreamCursor::advance((StreamCursor *)this,1);
      if (bVar1) {
        (context->version).first = (char *)beginString._0_8_;
        (context->version).second = (unsigned_long)beginString.second.first;
        context->bodyLength = pVar3.second;
        (context->msgType).first = (char *)msgType._0_8_;
        (context->msgType).second = (unsigned_long)msgType.second.first;
        messageVisitor.context = visitor;
        impl::
        visitMessage<Fixpp::impl::MessageVisitor<should_visit_message_with_multiple_chars_message_type::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>>,DefaultTestRules<Fixpp::v44::Spec::Dictionary>,Fixpp::TypedParsingContext<void>>
                  (context);
        return;
      }
      pcVar7 = "Expected Header after MsgType, got EOF";
    }
    else {
      pcVar7 = "Expected MsgType after BodyLength, got EOF";
    }
    goto LAB_00a2bdbf;
  }
  plVar8 = *(long **)this;
  pcVar7 = (char *)plVar8[2];
  pcVar5 = (char *)plVar8[3];
  if (pcVar5 == pcVar7) {
    lVar4 = (**(code **)(*plVar8 + 0x38))();
    if (lVar4 == 0) {
      uVar6 = 0x3f;
      goto LAB_00a2bdfd;
    }
    plVar8 = *(long **)this;
    pcVar7 = (char *)plVar8[2];
    pcVar5 = (char *)plVar8[3];
  }
  if (pcVar7 < pcVar5) {
    cVar2 = *pcVar7;
  }
  else {
    cVar2 = (**(code **)(*plVar8 + 0x48))();
  }
  uVar6 = (ulong)(uint)(int)cVar2;
LAB_00a2bdfd:
  ParsingContext::setError
            (context,ParsingError,"Could not parse BodyLength, expected int, got \'%c\'",uVar6);
  return;
}

Assistant:

void visitMessage(Context& context, Visitor& visitor, Rules rules)
    {
        auto& cursor = context.cursor;
        auto beginString = impl::matchTag<Tag::BeginString>(cursor);

        TRY_ADVANCE("Expected BodyLength after BeginString, got EOFs");

        auto bodyLength = impl::matchTag<Tag::BodyLength>(cursor);
        if (!bodyLength.first)
        {
            context.setError(ErrorKind::ParsingError,
                             "Could not parse BodyLength, expected int, got '%c'",
                              CURSOR_CURRENT(cursor));
            return;
        }

        TRY_ADVANCE("Expected MsgType after BodyLength, got EOF");
        auto msgType = impl::matchTag<Tag::MsgType>(cursor);
        TRY_ADVANCE("Expected Header after MsgType, got EOF");

        context.setVersion(beginString.second);
        context.setBodyLength(bodyLength.second);
        context.setMsgType(msgType.second);

        impl::MessageVisitor<Visitor, Rules> messageVisitor(context, visitor);
        impl::visitMessage(context, messageVisitor, rules);
    }